

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCreateTestSourceList.cxx
# Opt level: O3

bool cmCreateTestSourceList
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  value_type *pvVar4;
  char *__s;
  cmMakefile *this;
  pointer pcVar5;
  size_type sVar6;
  int iVar7;
  string *psVar8;
  undefined8 *puVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  long *plVar11;
  cmSourceFile *pcVar12;
  ulong *puVar13;
  value_type *__x;
  pointer pbVar14;
  undefined8 uVar15;
  _Alloc_hider _Var16;
  string *psVar17;
  bool bVar18;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string sourceListValue;
  string local_1f0;
  string configFile;
  string functionMapCode;
  string local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_150;
  string local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  cmNewLineStyle local_10c;
  string forwardDeclareCode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests_func_name;
  string local_b8;
  string function;
  string extraInclude;
  string driver;
  
  __x = (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_150 = args;
  if ((ulong)((long)pvVar4 - (long)__x) < 0x41) {
    configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&configFile,"called with wrong number of arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configFile._M_dataplus._M_p != &configFile.field_2) {
      operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
    }
    bVar18 = false;
  }
  else {
    extraInclude._M_dataplus._M_p = (pointer)&extraInclude.field_2;
    extraInclude._M_string_length = 0;
    extraInclude.field_2._M_local_buf[0] = '\0';
    function._M_dataplus._M_p = (pointer)&function.field_2;
    function._M_string_length = 0;
    function.field_2._M_local_buf[0] = '\0';
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    tests.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (__x != pvVar4) {
      do {
        iVar7 = std::__cxx11::string::compare((char *)__x);
        if (iVar7 == 0) {
          if (__x + 1 ==
              (local_150->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
            configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&configFile,"incorrect arguments to EXTRA_INCLUDE","");
            std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00345ad6:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)configFile._M_dataplus._M_p == &configFile.field_2) goto LAB_00344e55;
            goto LAB_00344e48;
          }
          configFile.field_2._8_8_ = __x[1]._M_dataplus._M_p;
          configFile.field_2._M_allocated_capacity = __x[1]._M_string_length;
          configFile._M_dataplus._M_p = (pointer)0xa;
          configFile._M_string_length = (size_type)anon_var_dwarf_991ae4;
          views._M_len = 3;
          views._M_array = (iterator)&configFile;
          cmCatViews_abi_cxx11_(&forwardDeclareCode,views);
          psVar8 = &extraInclude;
LAB_00344d72:
          __x = __x + 1;
          std::__cxx11::string::operator=((string *)psVar8,(string *)&forwardDeclareCode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)forwardDeclareCode._M_dataplus._M_p != &forwardDeclareCode.field_2) {
            operator_delete(forwardDeclareCode._M_dataplus._M_p,
                            CONCAT71(forwardDeclareCode.field_2._M_allocated_capacity._1_7_,
                                     forwardDeclareCode.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)__x);
          if (iVar7 == 0) {
            if (__x + 1 ==
                (local_150->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&configFile,"incorrect arguments to FUNCTION","");
              std::__cxx11::string::_M_assign((string *)&status->Error);
              goto LAB_00345ad6;
            }
            configFile._M_string_length = (size_type)__x[1]._M_dataplus._M_p;
            configFile._M_dataplus._M_p = (pointer)__x[1]._M_string_length;
            configFile.field_2._M_allocated_capacity = 0xc;
            configFile.field_2._8_8_ = anon_var_dwarf_10538cf;
            views_00._M_len = 2;
            views_00._M_array = (iterator)&configFile;
            cmCatViews_abi_cxx11_(&forwardDeclareCode,views_00);
            psVar8 = &function;
            goto LAB_00344d72;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests,__x);
        }
        __x = __x + 1;
      } while (__x != (local_150->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish);
    }
    pbVar14 = tests.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    __s = ((tests.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
    cmsys::SystemTools::GetFilenameExtension
              (&configFile,
               tests.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
    sVar6 = configFile._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)configFile._M_dataplus._M_p != &configFile.field_2) {
      operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
    }
    if (sVar6 < 2) {
      configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&configFile,"You must specify a file extension for the test driver file."
                 ,"");
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)configFile._M_dataplus._M_p != &configFile.field_2) {
LAB_00344e48:
        operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
      }
LAB_00344e55:
      bVar18 = false;
    }
    else {
      this = status->Makefile;
      psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      configFile._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
      configFile._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
      configFile.field_2._8_8_ = &forwardDeclareCode.field_2;
      forwardDeclareCode._M_dataplus._M_p = (pointer)0x1;
      forwardDeclareCode.field_2._M_local_buf[0] = '/';
      configFile.field_2._M_allocated_capacity = 1;
      views_01._M_len = 3;
      views_01._M_array = (iterator)&configFile;
      forwardDeclareCode._M_string_length = configFile.field_2._8_8_;
      cmCatViews_abi_cxx11_(&driver,views_01);
      psVar8 = cmSystemTools::GetCMakeRoot_abi_cxx11_();
      configFile._M_dataplus._M_p = (pointer)&configFile.field_2;
      pcVar5 = (psVar8->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&configFile,pcVar5,pcVar5 + psVar8->_M_string_length);
      std::__cxx11::string::append((char *)&configFile);
      psVar8 = pbVar14 + 2;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tests_func_name.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      forwardDeclareCode._M_dataplus._M_p = (pointer)&forwardDeclareCode.field_2;
      forwardDeclareCode._M_string_length = 0;
      forwardDeclareCode.field_2._M_local_buf[0] = '\0';
      if (psVar8 == tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode._M_string_length = 0;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)functionMapCode._M_dataplus._M_p;
      }
      else {
        local_158 = &functionMapCode.field_2;
        paVar2 = &sourceListValue.field_2;
        psVar17 = psVar8;
        do {
          iVar7 = std::__cxx11::string::compare((char *)psVar17);
          if (iVar7 == 0) {
            functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
            functionMapCode._M_string_length = 0;
            functionMapCode.field_2._M_local_buf[0] = '\0';
            local_158 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)functionMapCode._M_dataplus._M_p;
            if (psVar8 == tests.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00345651;
            break;
          }
          functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
          functionMapCode._M_string_length = 0;
          functionMapCode.field_2._M_local_buf[0] = '\0';
          cmsys::SystemTools::GetFilenamePath(&sourceListValue,psVar17);
          sVar6 = sourceListValue._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != paVar2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          if (sVar6 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&sourceListValue,psVar17);
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != paVar2) {
              operator_delete(sourceListValue._M_dataplus._M_p,
                              sourceListValue.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_178,psVar17);
            paVar3 = &local_1f0.field_2;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1f0.field_2._M_allocated_capacity = *puVar13;
              local_1f0.field_2._8_8_ = puVar9[3];
              local_1f0._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *puVar13;
              local_1f0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1f0._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_148,psVar17);
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar3) {
              uVar15 = local_1f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_148._M_string_length + local_1f0._M_string_length) {
              uVar15 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_148._M_dataplus._M_p != &local_148.field_2) {
                uVar15 = local_148.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar15 < local_148._M_string_length + local_1f0._M_string_length)
              goto LAB_003450cc;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_148,0,(char *)0x0,(ulong)local_1f0._M_dataplus._M_p)
              ;
            }
            else {
LAB_003450cc:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_1f0,(ulong)local_148._M_dataplus._M_p);
            }
            psVar1 = puVar9 + 2;
            if ((size_type *)*puVar9 == psVar1) {
              sourceListValue.field_2._M_allocated_capacity = *psVar1;
              sourceListValue.field_2._8_8_ = puVar9[3];
              sourceListValue._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              sourceListValue.field_2._M_allocated_capacity = *psVar1;
              sourceListValue._M_dataplus._M_p = (pointer)*puVar9;
            }
            sourceListValue._M_string_length = puVar9[1];
            *puVar9 = psVar1;
            puVar9[1] = 0;
            *(char *)psVar1 = '\0';
            std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sourceListValue._M_dataplus._M_p != paVar2) {
              operator_delete(sourceListValue._M_dataplus._M_p,
                              sourceListValue.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != paVar3) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
          }
          cmsys::SystemTools::ConvertToUnixSlashes(&functionMapCode);
          cmsys::SystemTools::MakeCidentifier(&sourceListValue,&functionMapCode);
          std::__cxx11::string::operator=((string *)&functionMapCode,(string *)&sourceListValue);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != paVar2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (tests_func_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              tests_func_name.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&functionMapCode);
          pbVar14 = tests_func_name.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&tests_func_name,&functionMapCode);
          if (_Var10._M_current == pbVar14) {
            std::__cxx11::string::append((char *)&forwardDeclareCode);
            std::__cxx11::string::_M_append
                      ((char *)&forwardDeclareCode,(ulong)functionMapCode._M_dataplus._M_p);
            std::__cxx11::string::append((char *)&forwardDeclareCode);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)functionMapCode._M_dataplus._M_p != &functionMapCode.field_2) {
            operator_delete(functionMapCode._M_dataplus._M_p,
                            CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                     functionMapCode.field_2._M_local_buf[0]) + 1);
          }
          psVar17 = psVar17 + 1;
        } while (psVar17 !=
                 tests.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        functionMapCode._M_dataplus._M_p = (pointer)&functionMapCode.field_2;
        functionMapCode.field_2._M_local_buf[0] = '\0';
        functionMapCode._M_string_length = 0;
        pbVar14 = tests_func_name.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar17 = psVar8;
        do {
          sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
          sourceListValue._M_string_length = 0;
          sourceListValue.field_2._M_allocated_capacity =
               sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
          cmsys::SystemTools::GetFilenamePath(&local_1f0,psVar17);
          sVar6 = local_1f0._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          if (sVar6 == 0) {
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_1f0,psVar17);
            std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1f0);
            uVar15 = local_1f0.field_2._M_allocated_capacity;
            _Var16._M_p = local_1f0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_003455c9;
          }
          else {
            cmsys::SystemTools::GetFilenamePath(&local_148,psVar17);
            paVar2 = &local_178.field_2;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_148);
            puVar13 = (ulong *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_178.field_2._M_allocated_capacity = *puVar13;
              local_178.field_2._8_8_ = plVar11[3];
              local_178._M_dataplus._M_p = (pointer)paVar2;
            }
            else {
              local_178.field_2._M_allocated_capacity = *puVar13;
              local_178._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_178._M_string_length = plVar11[1];
            *plVar11 = (long)puVar13;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            cmsys::SystemTools::GetFilenameWithoutLastExtension(&local_b8,psVar17);
            uVar15 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar2) {
              uVar15 = local_178.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar15 < local_b8._M_string_length + local_178._M_string_length) {
              uVar15 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                uVar15 = local_b8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar15 < local_b8._M_string_length + local_178._M_string_length)
              goto LAB_003454d7;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_b8,0,(char *)0x0,(ulong)local_178._M_dataplus._M_p);
            }
            else {
LAB_003454d7:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_178,(ulong)local_b8._M_dataplus._M_p);
            }
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1f0.field_2._M_allocated_capacity = *puVar13;
              local_1f0.field_2._8_8_ = puVar9[3];
            }
            else {
              local_1f0.field_2._M_allocated_capacity = *puVar13;
              local_1f0._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1f0._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)puVar13 = 0;
            std::__cxx11::string::operator=((string *)&sourceListValue,(string *)&local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != paVar2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            uVar15 = local_148.field_2._M_allocated_capacity;
            _Var16._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
LAB_003455c9:
              operator_delete(_Var16._M_p,uVar15 + 1);
            }
          }
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)sourceListValue._M_dataplus._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          std::__cxx11::string::_M_append
                    ((char *)&functionMapCode,(ulong)(pbVar14->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&functionMapCode);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
            operator_delete(sourceListValue._M_dataplus._M_p,
                            sourceListValue.field_2._M_allocated_capacity + 1);
          }
          psVar17 = psVar17 + 1;
          pbVar14 = pbVar14 + 1;
        } while (psVar17 !=
                 tests.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_00345651:
      if (extraInclude._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_EXTRA_INCLUDES","");
        value._M_str = extraInclude._M_dataplus._M_p;
        value._M_len = extraInclude._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      if (function._M_string_length != 0) {
        sourceListValue._M_dataplus._M_p = (pointer)&sourceListValue.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&sourceListValue,"CMAKE_TESTDRIVER_ARGVC_FUNCTION","");
        value_00._M_str = function._M_dataplus._M_p;
        value_00._M_len = function._M_string_length;
        cmMakefile::AddDefinition(this,&sourceListValue,value_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
          operator_delete(sourceListValue._M_dataplus._M_p,
                          sourceListValue.field_2._M_allocated_capacity + 1);
        }
      }
      paVar2 = &sourceListValue.field_2;
      sourceListValue._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FORWARD_DECLARE_TESTS","");
      value_01._M_str = forwardDeclareCode._M_dataplus._M_p;
      value_01._M_len = forwardDeclareCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != paVar2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      sourceListValue._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sourceListValue,"CMAKE_FUNCTION_TABLE_ENTRIES","");
      value_02._M_str = functionMapCode._M_dataplus._M_p;
      value_02._M_len = functionMapCode._M_string_length;
      cmMakefile::AddDefinition(this,&sourceListValue,value_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != paVar2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      cmNewLineStyle::cmNewLineStyle(&local_10c);
      iVar7 = cmMakefile::ConfigureFile(this,&configFile,&driver,false,true,false,0,local_10c);
      bVar18 = iVar7 != 0;
      sourceListValue._M_string_length = 0;
      sourceListValue.field_2._M_allocated_capacity =
           sourceListValue.field_2._M_allocated_capacity & 0xffffffffffffff00;
      sourceListValue._M_dataplus._M_p = (pointer)paVar2;
      pcVar12 = cmMakefile::GetOrCreateSource(this,&driver,false,Ambiguous);
      paVar2 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ABSTRACT","");
      cmSourceFile::SetProperty(pcVar12,&local_1f0,"0");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign((string *)&sourceListValue);
      if (psVar8 != tests.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          pcVar12 = cmMakefile::GetOrCreateSource(this,psVar8,false,Ambiguous);
          local_1f0._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"ABSTRACT","");
          cmSourceFile::SetProperty(pcVar12,&local_1f0,"0");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != paVar2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append((char *)&sourceListValue);
          std::__cxx11::string::_M_append
                    ((char *)&sourceListValue,(ulong)(psVar8->_M_dataplus)._M_p);
          psVar8 = psVar8 + 1;
        } while (psVar8 != tests.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,__s,(allocator<char> *)&local_178);
      value_03._M_str = sourceListValue._M_dataplus._M_p;
      value_03._M_len = sourceListValue._M_string_length;
      cmMakefile::AddDefinition(this,&local_1f0,value_03);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sourceListValue._M_dataplus._M_p != &sourceListValue.field_2) {
        operator_delete(sourceListValue._M_dataplus._M_p,
                        sourceListValue.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)functionMapCode._M_dataplus._M_p != local_158) {
        operator_delete(functionMapCode._M_dataplus._M_p,
                        CONCAT71(functionMapCode.field_2._M_allocated_capacity._1_7_,
                                 functionMapCode.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)forwardDeclareCode._M_dataplus._M_p != &forwardDeclareCode.field_2) {
        operator_delete(forwardDeclareCode._M_dataplus._M_p,
                        CONCAT71(forwardDeclareCode.field_2._M_allocated_capacity._1_7_,
                                 forwardDeclareCode.field_2._M_local_buf[0]) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tests_func_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)configFile._M_dataplus._M_p != &configFile.field_2) {
        operator_delete(configFile._M_dataplus._M_p,configFile.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)driver._M_dataplus._M_p != &driver.field_2) {
        operator_delete(driver._M_dataplus._M_p,driver.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tests);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)function._M_dataplus._M_p != &function.field_2) {
      operator_delete(function._M_dataplus._M_p,
                      CONCAT71(function.field_2._M_allocated_capacity._1_7_,
                               function.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)extraInclude._M_dataplus._M_p != &extraInclude.field_2) {
      operator_delete(extraInclude._M_dataplus._M_p,
                      CONCAT71(extraInclude.field_2._M_allocated_capacity._1_7_,
                               extraInclude.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar18;
}

Assistant:

bool cmCreateTestSourceList(std::vector<std::string> const& args,
                            cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  auto i = args.begin();
  std::string extraInclude;
  std::string function;
  std::vector<std::string> tests;
  // extract extra include and function ot
  for (; i != args.end(); i++) {
    if (*i == "EXTRA_INCLUDE") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to EXTRA_INCLUDE");
        return false;
      }
      extraInclude = cmStrCat("#include \"", *i, "\"\n");
    } else if (*i == "FUNCTION") {
      ++i;
      if (i == args.end()) {
        status.SetError("incorrect arguments to FUNCTION");
        return false;
      }
      function = cmStrCat(*i, "(&ac, &av);\n");
    } else {
      tests.push_back(*i);
    }
  }
  i = tests.begin();

  // Name of the source list

  const char* sourceList = i->c_str();
  ++i;

  // Name of the test driver
  // make sure they specified an extension
  if (cmSystemTools::GetFilenameExtension(*i).size() < 2) {
    status.SetError(
      "You must specify a file extension for the test driver file.");
    return false;
  }
  cmMakefile& mf = status.GetMakefile();
  std::string driver = cmStrCat(mf.GetCurrentBinaryDirectory(), '/', *i);
  ++i;

  std::string configFile = cmSystemTools::GetCMakeRoot();

  configFile += "/Templates/TestDriver.cxx.in";
  // Create the test driver file

  auto testsBegin = i;
  std::vector<std::string> tests_func_name;

  // The rest of the arguments consist of a list of test source files.
  // Sadly, they can be in directories. Let's find a unique function
  // name for the corresponding test, and push it to the tests_func_name
  // list.
  // For the moment:
  //   - replace spaces ' ', ':' and '/' with underscores '_'
  std::string forwardDeclareCode;
  for (i = testsBegin; i != tests.end(); ++i) {
    if (*i == "EXTRA_INCLUDE") {
      break;
    }
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    cmSystemTools::ConvertToUnixSlashes(func_name);
    func_name = cmSystemTools::MakeCidentifier(func_name);
    bool already_declared =
      std::find(tests_func_name.begin(), tests_func_name.end(), func_name) !=
      tests_func_name.end();
    tests_func_name.push_back(func_name);
    if (!already_declared) {
      forwardDeclareCode += "int ";
      forwardDeclareCode += func_name;
      forwardDeclareCode += "(int, char*[]);\n";
    }
  }

  std::string functionMapCode;
  std::vector<std::string>::iterator j;
  for (i = testsBegin, j = tests_func_name.begin(); i != tests.end();
       ++i, ++j) {
    std::string func_name;
    if (!cmSystemTools::GetFilenamePath(*i).empty()) {
      func_name = cmSystemTools::GetFilenamePath(*i) + "/" +
        cmSystemTools::GetFilenameWithoutLastExtension(*i);
    } else {
      func_name = cmSystemTools::GetFilenameWithoutLastExtension(*i);
    }
    functionMapCode += "  {\n"
                       "    \"";
    functionMapCode += func_name;
    functionMapCode += "\",\n"
                       "    ";
    functionMapCode += *j;
    functionMapCode += "\n"
                       "  },\n";
  }
  if (!extraInclude.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_EXTRA_INCLUDES", extraInclude);
  }
  if (!function.empty()) {
    mf.AddDefinition("CMAKE_TESTDRIVER_ARGVC_FUNCTION", function);
  }
  mf.AddDefinition("CMAKE_FORWARD_DECLARE_TESTS", forwardDeclareCode);
  mf.AddDefinition("CMAKE_FUNCTION_TABLE_ENTRIES", functionMapCode);
  bool res = true;
  if (!mf.ConfigureFile(configFile, driver, false, true, false)) {
    res = false;
  }

  // Construct the source list.
  std::string sourceListValue;
  {
    cmSourceFile* sf = mf.GetOrCreateSource(driver);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue = args[1];
  }
  for (i = testsBegin; i != tests.end(); ++i) {
    cmSourceFile* sf = mf.GetOrCreateSource(*i);
    sf->SetProperty("ABSTRACT", "0");
    sourceListValue += ";";
    sourceListValue += *i;
  }

  mf.AddDefinition(sourceList, sourceListValue);
  return res;
}